

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheGL::Initialize
          (ShaderResourceCacheGL *this,TResourceCount *ResCount,IMemoryAllocator *MemAllocator,
          Uint64 DynamicUBOSlotMask,Uint64 DynamicSSBOSlotMask)

{
  Uint16 UVar1;
  ushort uVar2;
  bool bVar3;
  Uint32 UVar4;
  int iVar5;
  const_reference pvVar6;
  Char *pCVar7;
  char (*Args_1) [46];
  undefined4 extraout_var;
  pointer __s;
  CachedUB *this_00;
  CachedResourceView *pCVar8;
  CachedSSBO *this_01;
  uint local_130;
  uint local_12c;
  Uint32 s_1;
  Uint32 i;
  Uint32 s;
  Uint32 cb;
  unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
  local_118;
  undefined1 local_108 [8];
  string msg_5;
  size_t BufferSize;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Uint64 DynamicSSBOSlotMask_local;
  Uint64 DynamicUBOSlotMask_local;
  IMemoryAllocator *MemAllocator_local;
  TResourceCount *ResCount_local;
  ShaderResourceCacheGL *this_local;
  
  this->m_DynamicUBOSlotMask = DynamicUBOSlotMask;
  this->m_DynamicSSBOSlotMask = DynamicSSBOSlotMask;
  msg.field_2._8_8_ = DynamicSSBOSlotMask;
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_pResourceData);
  if (bVar3) {
    FormatString<char[35]>((string *)local_50,(char (*) [35])"Cache has already been initialized");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x3a);
    std::__cxx11::string::~string((string *)local_50);
  }
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,0);
  this->m_TexturesOffset = *pvVar6 * 0x18;
  UVar1 = this->m_TexturesOffset;
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,1);
  this->m_ImagesOffset = UVar1 + *pvVar6 * 0x18;
  UVar1 = this->m_ImagesOffset;
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,2);
  this->m_SSBOsOffset = UVar1 + *pvVar6 * 0x18;
  UVar1 = this->m_SSBOsOffset;
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,3);
  this->m_MemoryEndOffset = UVar1 + *pvVar6 * 0x10;
  UVar4 = GetUBCount(this);
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,0);
  if (UVar4 != *pvVar6) {
    FormatString<char[26],char[76]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetUBCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_UNIFORM_BUFFER])",
               (char (*) [76])(ulong)*pvVar6);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x42);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  UVar4 = GetTextureCount(this);
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,1);
  if (UVar4 != *pvVar6) {
    FormatString<char[26],char[74]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetTextureCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_TEXTURE])",
               (char (*) [74])(ulong)*pvVar6);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x43);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  UVar4 = GetImageCount(this);
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,2);
  if (UVar4 != *pvVar6) {
    FormatString<char[26],char[70]>
              ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetImageCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_IMAGE])",
               (char (*) [70])(ulong)*pvVar6);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  UVar4 = GetSSBOCount(this);
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](ResCount,3);
  if (UVar4 != *pvVar6) {
    FormatString<char[26],char[78]>
              ((string *)&BufferSize,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetSSBOCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_STORAGE_BUFFER])",
               (char (*) [78])(ulong)*pvVar6);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)&BufferSize);
  }
  uVar2 = this->m_MemoryEndOffset;
  msg_5.field_2._8_8_ = (char (*) [46])(ulong)uVar2;
  Args_1 = (char (*) [46])GetRequiredMemorySize(ResCount);
  if ((char (*) [46])(ulong)uVar2 != Args_1) {
    FormatString<char[26],char[46]>
              ((string *)local_108,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BufferSize == GetRequiredMemorySize(ResCount)",Args_1);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x4a);
    std::__cxx11::string::~string((string *)local_108);
  }
  if (msg_5.field_2._8_8_ != 0) {
    iVar5 = (**MemAllocator->_vptr_IMemoryAllocator)
                      (MemAllocator,msg_5.field_2._8_8_,"Shader resource cache data buffer",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                       ,0x4f);
    STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>::STDDeleter
              ((STDDeleter<unsigned_char,_Diligent::IMemoryAllocator> *)&s,MemAllocator);
    std::unique_ptr<unsigned_char,Diligent::STDDeleter<unsigned_char,Diligent::IMemoryAllocator>>::
    unique_ptr<Diligent::STDDeleter<unsigned_char,Diligent::IMemoryAllocator>,void>
              ((unique_ptr<unsigned_char,Diligent::STDDeleter<unsigned_char,Diligent::IMemoryAllocator>>
                *)&local_118,(pointer)CONCAT44(extraout_var,iVar5),
               (__enable_if_t<_is_lvalue_reference<STDDeleter<unsigned_char,_IMemoryAllocator>_>::value,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_&&>
                )&s);
    std::unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
    ::operator=(&this->m_pResourceData,&local_118);
    std::unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
    ::~unique_ptr(&local_118);
    __s = std::
          unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          ::get(&this->m_pResourceData);
    memset(__s,0,msg_5.field_2._8_8_);
  }
  for (i = 0; UVar4 = GetUBCount(this), i < UVar4; i = i + 1) {
    this_00 = GetUB(this,i);
    CachedUB::CachedUB(this_00);
  }
  for (s_1 = 0; UVar4 = GetTextureCount(this), s_1 < UVar4; s_1 = s_1 + 1) {
    pCVar8 = GetTexture(this,s_1);
    CachedResourceView::CachedResourceView(pCVar8);
  }
  for (local_12c = 0; UVar4 = GetImageCount(this), local_12c < UVar4; local_12c = local_12c + 1) {
    pCVar8 = GetImage(this,local_12c);
    CachedResourceView::CachedResourceView(pCVar8);
  }
  for (local_130 = 0; UVar4 = GetSSBOCount(this), local_130 < UVar4; local_130 = local_130 + 1) {
    this_01 = GetSSBO(this,local_130);
    CachedSSBO::CachedSSBO(this_01);
  }
  return;
}

Assistant:

void ShaderResourceCacheGL::Initialize(const TResourceCount& ResCount, IMemoryAllocator& MemAllocator, Uint64 DynamicUBOSlotMask, Uint64 DynamicSSBOSlotMask)
{
    m_DynamicUBOSlotMask  = DynamicUBOSlotMask;
    m_DynamicSSBOSlotMask = DynamicSSBOSlotMask;

    VERIFY(!m_pResourceData, "Cache has already been initialized");

    // clang-format off
    m_TexturesOffset  = static_cast<Uint16>(m_UBsOffset      + sizeof(CachedUB)           * ResCount[BINDING_RANGE_UNIFORM_BUFFER]);
    m_ImagesOffset    = static_cast<Uint16>(m_TexturesOffset + sizeof(CachedResourceView) * ResCount[BINDING_RANGE_TEXTURE]);
    m_SSBOsOffset     = static_cast<Uint16>(m_ImagesOffset   + sizeof(CachedResourceView) * ResCount[BINDING_RANGE_IMAGE]);
    m_MemoryEndOffset = static_cast<Uint16>(m_SSBOsOffset    + sizeof(CachedSSBO)         * ResCount[BINDING_RANGE_STORAGE_BUFFER]);

    VERIFY_EXPR(GetUBCount()      == static_cast<Uint32>(ResCount[BINDING_RANGE_UNIFORM_BUFFER]));
    VERIFY_EXPR(GetTextureCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_TEXTURE]));
    VERIFY_EXPR(GetImageCount()   == static_cast<Uint32>(ResCount[BINDING_RANGE_IMAGE]));
    VERIFY_EXPR(GetSSBOCount()    == static_cast<Uint32>(ResCount[BINDING_RANGE_STORAGE_BUFFER]));
    // clang-format on

    size_t BufferSize = m_MemoryEndOffset;

    VERIFY_EXPR(BufferSize == GetRequiredMemorySize(ResCount));

    if (BufferSize > 0)
    {
        m_pResourceData = decltype(m_pResourceData){
            ALLOCATE(MemAllocator, "Shader resource cache data buffer", Uint8, BufferSize),
            STDDeleter<Uint8, IMemoryAllocator>(MemAllocator) //
        };
        memset(m_pResourceData.get(), 0, BufferSize);
    }

    // Explicitly construct all objects
    for (Uint32 cb = 0; cb < GetUBCount(); ++cb)
        new (&GetUB(cb)) CachedUB;

    for (Uint32 s = 0; s < GetTextureCount(); ++s)
        new (&GetTexture(s)) CachedResourceView;

    for (Uint32 i = 0; i < GetImageCount(); ++i)
        new (&GetImage(i)) CachedResourceView;

    for (Uint32 s = 0; s < GetSSBOCount(); ++s)
        new (&GetSSBO(s)) CachedSSBO;
}